

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  cmValue cVar4;
  char *extraout_RDX;
  double dVar5;
  string_view value;
  string_view value_00;
  string_view value_01;
  char *end;
  char *local_20;
  
  psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
  bVar1 = cmValue::IsOn((cmValue *)psVar3->_M_string_length,value);
  bVar2 = true;
  if (!bVar1) {
    psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
    value_00._M_str = (psVar3->_M_dataplus)._M_p;
    value_00._M_len = psVar3->_M_string_length;
    bVar1 = cmValue::IsOff(value_00);
    if (!bVar1) {
      bVar1 = cmExpandedCommandArgument::empty(arg);
      if (!bVar1) {
        psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
        dVar5 = strtod((psVar3->_M_dataplus)._M_p,&local_20);
        if (*local_20 == '\0') {
          return (bool)(-(dVar5 != 0.0) & 1);
        }
      }
      cVar4 = GetDefinitionIfUnquoted(this,arg);
      if (cVar4.Value != (string *)0x0) {
        value_01._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
        value_01._M_len = (cVar4.Value)->_M_string_length;
        bVar1 = cmValue::IsOff(value_01);
        return !bVar1;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic and named constants.
  if (cmIsOn(arg.GetValue())) {
    return true;
  }
  if (cmIsOff(arg.GetValue())) {
    return false;
  }

  // Check for numbers.
  if (!arg.empty()) {
    char* end;
    const double d = std::strtod(arg.GetValue().c_str(), &end);
    if (*end == '\0') {
      // The whole string is a number.  Use C conversion to bool.
      return static_cast<bool>(d);
    }
  }

  // Check definition.
  cmValue def = this->GetDefinitionIfUnquoted(arg);
  return !def.IsOff();
}